

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O1

void __thiscall mocker::ir::Load::~Load(Load *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this[-1].addr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__Load_001f0e70;
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Load_001f0e90;
  p_Var1 = (this->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Definition_001efc00;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->super_Definition)._vptr_Definition
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(&this[-1].addr,0x38);
  return;
}

Assistant:

Load(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> addr)
      : IRInst(InstType::Load), Definition(std::move(dest)),
        addr(std::move(addr)) {}